

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycling_allocator.hpp
# Opt level: O0

wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:50:26),_asio::any_io_executor>
* __thiscall
asio::detail::
recycling_allocator<asio::detail::wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:50:26),_asio::any_io_executor>,_asio::detail::thread_info_base::default_tag>
::allocate(recycling_allocator<asio::detail::wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:50:26),_asio::any_io_executor>,_asio::detail::thread_info_base::default_tag>
           *this,size_t n)

{
  thread_info_base *ptVar1;
  wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:50:26),_asio::any_io_executor>
  *pwVar2;
  long in_RSI;
  void *p;
  
  ptVar1 = thread_context::top_of_thread_call_stack();
  pwVar2 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:50:26),_asio::any_io_executor>
            *)thread_info_base::allocate<asio::detail::thread_info_base::default_tag>
                        (ptVar1,in_RSI << 7,8);
  return pwVar2;
}

Assistant:

T* allocate(std::size_t n)
  {
#if !defined(ASIO_DISABLE_SMALL_BLOCK_RECYCLING)
    void* p = thread_info_base::allocate(Purpose(),
        thread_context::top_of_thread_call_stack(),
        sizeof(T) * n, alignof(T));
#else // !defined(ASIO_DISABLE_SMALL_BLOCK_RECYCLING)
    void* p = asio::aligned_new(align, s);
#endif // !defined(ASIO_DISABLE_SMALL_BLOCK_RECYCLING)
    return static_cast<T*>(p);
  }